

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::BasicStdLayoutBase3VS::Run(BasicStdLayoutBase3VS *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  undefined4 extraout_var;
  void *pvVar4;
  void **ppvVar5;
  long lVar6;
  void *pvVar7;
  bool bVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_data [2];
  allocator<char> local_a9;
  string local_a8;
  void *local_88;
  long lStack_80;
  undefined8 local_78;
  void *pvStack_70;
  long local_68;
  undefined8 uStack_60;
  GLuint *local_58;
  string local_50;
  
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,2)
  ;
  lVar10 = 0x10;
  if (bVar1) {
    ppvVar5 = &local_88;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    pvStack_70 = (void *)0x0;
    local_88 = (void *)0x0;
    lStack_80 = 0;
    iVar2 = (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              _vptr_GLWrapper[9])(this,ppvVar5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,(char *)CONCAT44(extraout_var,iVar2),&local_a9);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,0x1af8059);
    GVar3 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_a8,&local_50);
    this->m_program = GVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lVar10 = -1;
    if (bVar1) {
      local_58 = this->m_buffer;
      glu::CallLogWrapper::glGenBuffers(this_00,4,local_58);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x8a11,0,*local_58);
      glu::CallLogWrapper::glBufferData(this_00,0x8a11,lStack_80 - (long)local_88,local_88,0x88e4);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer[1]);
      glu::CallLogWrapper::glBufferData
                (this_00,0x90d2,local_68 - (long)pvStack_70,pvStack_70,0x88e4);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,
                 lStack_80 - (long)local_88,(allocator_type *)&local_50);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_buffer[2]);
      glu::CallLogWrapper::glBufferData
                (this_00,0x90d2,lStack_80 - (long)local_88,local_a8._M_dataplus._M_p,0x88e4);
      if (local_a8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_a8._M_dataplus._M_p,
                        local_a8.field_2._M_allocated_capacity - (long)local_a8._M_dataplus._M_p);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,
                 local_68 - (long)pvStack_70,(allocator_type *)&local_50);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,2,this->m_buffer[3]);
      glu::CallLogWrapper::glBufferData
                (this_00,0x90d2,local_68 - (long)pvStack_70,local_a8._M_dataplus._M_p,0x88e4);
      if (local_a8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_a8._M_dataplus._M_p,
                        local_a8.field_2._M_allocated_capacity - (long)local_a8._M_dataplus._M_p);
      }
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glEnable(this_00,0x8c89);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
      lVar10 = 2;
      bVar9 = 1;
      bVar1 = true;
      do {
        bVar8 = bVar1;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,
                   (long)ppvVar5[1] - (long)*ppvVar5,(allocator_type *)&local_50);
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,local_58[lVar10]);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
        glu::CallLogWrapper::glGetBufferSubData
                  (this_00,0x90d2,0,(long)ppvVar5[1] - (long)*ppvVar5,local_a8._M_dataplus._M_p);
        pvVar4 = *ppvVar5;
        pvVar7 = ppvVar5[1];
        if (pvVar7 != pvVar4) {
          uVar11 = 0;
          do {
            if (*(char *)((long)pvVar4 + uVar11) != local_a8._M_dataplus._M_p[uVar11]) {
              anon_unknown_0::Output
                        ("Byte at index %3d is %2x should be %2x.\n",uVar11 & 0xffffffff);
              pvVar4 = *ppvVar5;
              pvVar7 = ppvVar5[1];
              bVar9 = 0;
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < (ulong)((long)pvVar7 - (long)pvVar4));
        }
        if (local_a8._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_a8._M_dataplus._M_p,
                          local_a8.field_2._M_allocated_capacity - (long)local_a8._M_dataplus._M_p);
        }
        lVar10 = 3;
        ppvVar5 = &pvStack_70;
        bVar1 = false;
      } while (bVar8);
      lVar10 = -(ulong)(~bVar9 & 1);
    }
    lVar6 = 0x30;
    do {
      pvVar4 = *(void **)((long)&local_a8._M_string_length + lVar6);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,*(long *)((long)&local_a8.field_2 + lVar6 + 8) - (long)pvVar4);
      }
      lVar6 = lVar6 + -0x18;
    } while (lVar6 != 0);
  }
  return lVar10;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(2))
			return NOT_SUPPORTED;
		std::vector<GLubyte> in_data[2];
		const char*			 glsl_vs = GetInput(in_data);

		m_program = CreateProgram(glsl_vs, "");
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(4, m_buffer);

		// input buffers
		glBindBufferBase(GL_UNIFORM_BUFFER, 0, m_buffer[0]);
		glBufferData(GL_UNIFORM_BUFFER, (GLsizeiptr)in_data[0].size(), &in_data[0][0], GL_STATIC_DRAW);

		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer[1]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[1].size(), &in_data[1][0], GL_STATIC_DRAW);

		/* output buffer 0 */
		{
			std::vector<GLubyte> out_data(in_data[0].size());
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[0].size(), &out_data[0], GL_STATIC_DRAW);
		}
		/* output buffer 1 */
		{
			std::vector<GLubyte> out_data(in_data[1].size());
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[1].size(), &out_data[0], GL_STATIC_DRAW);
		}

		glGenVertexArrays(1, &m_vertex_array);
		glEnable(GL_RASTERIZER_DISCARD);

		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_POINTS, 0, 1);

		bool status = true;
		for (int j = 0; j < 2; ++j)
		{
			std::vector<GLubyte> out_data(in_data[j].size());
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[j + 2]);
			glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)in_data[j].size(), &out_data[0]);

			for (size_t i = 0; i < in_data[j].size(); ++i)
			{
				if (in_data[j][i] != out_data[i])
				{
					Output("Byte at index %3d is %2x should be %2x.\n", static_cast<int>(i), out_data[i],
						   in_data[j][i]);
					status = false;
				}
			}
		}
		if (!status)
			return ERROR;
		return NO_ERROR;
	}